

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.cpp
# Opt level: O0

void __thiscall
slang::parsing::NumberParser::addDigit(NumberParser *this,logic_t digit,int maxValue)

{
  bool bVar1;
  size_type sVar2;
  reference plVar3;
  int maxValue_local;
  NumberParser *this_local;
  logic_t digit_local;
  
  this_local._7_1_ = digit.value;
  bVar1 = logic_t::isUnknown((logic_t *)((long)&this_local + 7));
  if (bVar1) {
    this->hasUnknown = true;
  }
  else {
    if (maxValue <= (int)(uint)this_local._7_1_) {
      assert::assertFailed
                ("digit.value < maxValue",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/NumberParser.cpp"
                 ,0x110,"void slang::parsing::NumberParser::addDigit(logic_t, int)");
    }
    sVar2 = SmallVectorBase<slang::logic_t>::size
                      (&(this->digits).super_SmallVectorBase<slang::logic_t>);
    if ((sVar2 == 1) &&
       (plVar3 = SmallVectorBase<slang::logic_t>::front
                           (&(this->digits).super_SmallVectorBase<slang::logic_t>),
       plVar3->value == '\0')) {
      if (this_local._7_1_ == 0) {
        return;
      }
      SmallVectorBase<slang::logic_t>::pop_back
                (&(this->digits).super_SmallVectorBase<slang::logic_t>);
    }
  }
  SmallVectorBase<slang::logic_t>::push_back
            (&(this->digits).super_SmallVectorBase<slang::logic_t>,
             (logic_t *)((long)&this_local + 7));
  return;
}

Assistant:

void NumberParser::addDigit(logic_t digit, int maxValue) {
    // Leading zeros obviously don't count towards our bit limit, so
    // only count them if we've seen other non-zero digits
    if (digit.isUnknown()) {
        // Keep one leading zero, if any, for msb extension
        hasUnknown = true;
    }
    else {
        ASSERT(digit.value < maxValue);
        if (digits.size() == 1 && digits.front().value == 0) {
            if (digit.value == 0)
                return; // at most one leading zero

            // If first nonzero not unknown, no leading zeros
            digits.pop_back();
        }
    }
    digits.push_back(digit);
}